

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O1

USTATUS __thiscall FfsParser::parseRawArea(FfsParser *this,UModelIndex *index)

{
  CBString *this_00;
  undefined1 *puVar1;
  TreeModel *pTVar2;
  undefined8 *puVar3;
  long *plVar4;
  long lVar5;
  UINT8 *pUVar6;
  undefined8 uVar7;
  bool bVar8;
  UINT32 UVar9;
  UINT8 UVar10;
  byte bVar11;
  UINT32 UVar12;
  uint uVar13;
  int iVar14;
  USTATUS UVar15;
  vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_> *this_01;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  int i;
  long *plVar19;
  UINT8 *buffer;
  insyde_fdm_t *this_02;
  _Alloc_hider _Var20;
  UModelIndex *parent;
  uint32_t offset;
  undefined8 *puVar21;
  long lVar22;
  UINT8 itemType;
  FfsParser *local_628;
  UINT8 prevItemType;
  UINT32 local_618;
  UINT32 itemOffset;
  UModelIndex *local_610;
  UModelIndex paddingIndex;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e8;
  UINT32 prevItemOffset;
  UINT32 prevItemSize;
  UINT32 itemSize;
  UByteArray fdm;
  UINT32 itemAltSize;
  ulong local_598;
  CBString info_1;
  CBString info;
  CBString name;
  undefined1 local_538 [32];
  UByteArray header;
  UByteArray data;
  UINT32 prevItemAltSize;
  UByteArray body;
  insyde_fdm_t parsed;
  umemstream is;
  CBString local_280;
  CBString name_1;
  CBString local_250;
  EFI_GUID guid;
  CBString local_228;
  CBString text;
  UByteArray padding;
  ios_base aiStack_178 [280];
  CBString local_60;
  UModelIndex headerIndex;
  
  if (index->r < 0) {
    return 1;
  }
  if (index->c < 0) {
    return 1;
  }
  if (index->m == (TreeModel *)0x0) {
    return 1;
  }
  local_628 = this;
  TreeModel::body(&data,this->model,index);
  TreeModel::header(&padding,this->model,index);
  local_618 = (UINT32)padding.d._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)padding.d._M_dataplus._M_p != &padding.d.field_2) {
    operator_delete(padding.d._M_dataplus._M_p);
  }
  Bstrlib::CBString::CBString(&name);
  Bstrlib::CBString::CBString(&info);
  prevItemType = '\0';
  prevItemOffset = 0;
  prevItemSize = 0;
  prevItemAltSize = 0;
  UVar15 = findNextRawAreaItem(local_628,index,0,&prevItemType,&prevItemOffset,&prevItemSize,
                               &prevItemAltSize);
  if (UVar15 == 0) {
    UVar10 = TreeModel::type(local_628->model,index);
    if ((UVar10 == '?') && (UVar10 = TreeModel::subtype(local_628->model,index), UVar10 == '\x01'))
    {
      UVar12 = TreeModel::base(local_628->model,index);
      local_628->protectedRegionsBase = (ulong)prevItemOffset + (ulong)UVar12;
    }
    UVar12 = prevItemOffset;
    local_610 = index;
    if (prevItemOffset != 0) {
      UByteArray::left(&padding,&data,prevItemOffset);
      Bstrlib::CBString::CBString((CBString *)&is,"Padding");
      Bstrlib::CBString::operator=(&name,(CBString *)&is);
      Bstrlib::CBString::~CBString((CBString *)&is);
      usprintf((CBString *)&is,"Full size: %Xh (%u)",(ulong)(UINT32)padding.d._M_string_length);
      Bstrlib::CBString::operator=(&info,(CBString *)&is);
      Bstrlib::CBString::~CBString((CBString *)&is);
      pTVar2 = local_628->model;
      UVar10 = getPaddingType(&padding);
      Bstrlib::CBString::CBString((CBString *)&paddingIndex);
      puVar1 = &is.super_istream.field_0x10;
      is.super_istream._M_gcount = 0;
      is.super_istream._16_8_ = is.super_istream._16_8_ & 0xffffffffffffff00;
      parsed.super_kstruct.m__io = (kstream *)0x0;
      parsed.m_signature._0_1_ = 0;
      parsed.super_kstruct._vptr_kstruct = (_func_int **)&parsed.m_signature;
      is.super_istream._vptr_basic_istream = (_func_int **)puVar1;
      TreeModel::addItem((UModelIndex *)&fdm,pTVar2,local_618,'@',UVar10,&name,
                         (CBString *)&paddingIndex,&info,(UByteArray *)&is,&padding,
                         (UByteArray *)&parsed,Fixed,local_610,'\0');
      if (parsed.super_kstruct._vptr_kstruct != (_func_int **)&parsed.m_signature) {
        operator_delete(parsed.super_kstruct._vptr_kstruct);
      }
      if (is.super_istream._vptr_basic_istream != (_func_int **)puVar1) {
        operator_delete(is.super_istream._vptr_basic_istream);
      }
      Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)padding.d._M_dataplus._M_p != &padding.d.field_2) {
        operator_delete(padding.d._M_dataplus._M_p);
      }
    }
    itemType = prevItemType;
    itemOffset = UVar12;
    itemSize = prevItemSize;
    itemAltSize = prevItemAltSize;
    this_00 = &local_628->securityInfo;
    this_01 = &local_628->protectedRanges;
    UVar15 = 0;
    while (UVar12 = itemOffset, UVar15 == 0) {
      uVar16 = prevItemSize + prevItemOffset;
      if (uVar16 <= itemOffset && itemOffset - uVar16 != 0) {
        UByteArray::mid(&padding,&data,uVar16,itemOffset - uVar16);
        Bstrlib::CBString::CBString((CBString *)&is,"Padding");
        Bstrlib::CBString::operator=(&name,(CBString *)&is);
        Bstrlib::CBString::~CBString((CBString *)&is);
        usprintf((CBString *)&is,"Full size: %Xh (%u)",(ulong)(UINT32)padding.d._M_string_length);
        Bstrlib::CBString::operator=(&info,(CBString *)&is);
        Bstrlib::CBString::~CBString((CBString *)&is);
        pTVar2 = local_628->model;
        UVar10 = getPaddingType(&padding);
        Bstrlib::CBString::CBString((CBString *)&paddingIndex);
        is.super_istream._vptr_basic_istream = (_func_int **)&is.super_istream.field_0x10;
        is.super_istream._M_gcount = 0;
        is.super_istream._16_8_ = is.super_istream._16_8_ & 0xffffffffffffff00;
        parsed.super_kstruct.m__io = (kstream *)0x0;
        parsed.m_signature._0_1_ = 0;
        parsed.super_kstruct._vptr_kstruct = (_func_int **)&parsed.m_signature;
        TreeModel::addItem((UModelIndex *)&fdm,pTVar2,uVar16 + local_618,'@',UVar10,&name,
                           (CBString *)&paddingIndex,&info,(UByteArray *)&is,&padding,
                           (UByteArray *)&parsed,Fixed,local_610,'\0');
        if (parsed.super_kstruct._vptr_kstruct != (_func_int **)&parsed.m_signature) {
          operator_delete(parsed.super_kstruct._vptr_kstruct);
        }
        if (is.super_istream._vptr_basic_istream != (_func_int **)&is.super_istream.field_0x10) {
          operator_delete(is.super_istream._vptr_basic_istream);
        }
        Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)padding.d._M_dataplus._M_p != &padding.d.field_2) {
          operator_delete(padding.d._M_dataplus._M_p);
        }
      }
      UVar9 = itemSize;
      this_02 = &parsed;
      if (((uint)data.d._M_string_length < itemSize) ||
         ((uint)data.d._M_string_length < itemSize + UVar12)) {
        UByteArray::mid(&padding,&data,UVar12,-1);
        Bstrlib::CBString::CBString((CBString *)&is,"Padding");
        Bstrlib::CBString::operator=(&name,(CBString *)&is);
        Bstrlib::CBString::~CBString((CBString *)&is);
        usprintf((CBString *)&is,"Full size: %Xh (%u)",(ulong)(UINT32)padding.d._M_string_length);
        Bstrlib::CBString::operator=(&info,(CBString *)&is);
        Bstrlib::CBString::~CBString((CBString *)&is);
        pTVar2 = local_628->model;
        UVar10 = getPaddingType(&padding);
        Bstrlib::CBString::CBString((CBString *)&fdm);
        is.super_istream._vptr_basic_istream = (_func_int **)&is.super_istream.field_0x10;
        is.super_istream._M_gcount = 0;
        is.super_istream._16_8_ = is.super_istream._16_8_ & 0xffffffffffffff00;
        parsed.super_kstruct.m__io = (kstream *)0x0;
        parsed.m_signature._0_1_ = 0;
        parsed.super_kstruct._vptr_kstruct = (_func_int **)&parsed.m_signature;
        TreeModel::addItem(&paddingIndex,pTVar2,UVar12 + local_618,'@',UVar10,&name,(CBString *)&fdm
                           ,&info,(UByteArray *)&is,&padding,(UByteArray *)&parsed,Fixed,local_610,
                           '\0');
        if (parsed.super_kstruct._vptr_kstruct != (_func_int **)&parsed.m_signature) {
          operator_delete(parsed.super_kstruct._vptr_kstruct);
        }
        if (is.super_istream._vptr_basic_istream != (_func_int **)&is.super_istream.field_0x10) {
          operator_delete(is.super_istream._vptr_basic_istream);
        }
        Bstrlib::CBString::~CBString((CBString *)&fdm);
        usprintf((CBString *)&is,"%s: one of objects inside overlaps the end of data","parseRawArea"
                );
        msg(local_628,(CBString *)&is,&paddingIndex);
        Bstrlib::CBString::~CBString((CBString *)&is);
        prevItemOffset = itemOffset;
        prevItemSize = (UINT32)padding.d._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)padding.d._M_dataplus._M_p != &padding.d.field_2) {
          operator_delete(padding.d._M_dataplus._M_p);
        }
        break;
      }
      if (itemType < 0x55) {
        if (itemType != 'A') {
          if (itemType == 'L') {
            UByteArray::mid(&fdm,&data,UVar12,itemSize);
            umemstream::umemstream
                      ((umemstream *)&is.super_istream,fdm.d._M_dataplus._M_p,
                       (long)(int)(uint)fdm.d._M_string_length);
            kaitai::kstream::kstream((kstream *)&padding,&is.super_istream);
            insyde_fdm_t::insyde_fdm_t
                      (this_02,(kstream *)&padding,(kstruct *)0x0,(insyde_fdm_t *)0x0);
            uVar16 = (uint)fdm.d._M_string_length;
            UByteArray::left(&header,&fdm,parsed.m_data_offset);
            UByteArray::mid(&body,&fdm,(uint)header.d._M_string_length,
                            uVar16 - (uint)header.d._M_string_length);
            Bstrlib::CBString::CBString(&name_1,"Insyde H2O FlashDeviceMap");
            local_598 = (ulong)parsed.m_data_offset;
            usprintf(&info_1,
                     "Signature: HFDM\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nData offset: %Xh\nEntry size: %Xh (%u)\nEntry format: %02Xh\nRevision: %02Xh\nExtension count: %u\nFlash descriptor base address: %08Xh\nChecksum: %02Xh"
                     ,(ulong)uVar16,(ulong)uVar16,(ulong)(uint)header.d._M_string_length,
                     (ulong)(uint)header.d._M_string_length,(ulong)(uint)body.d._M_string_length,
                     (ulong)(uint)body.d._M_string_length,local_598,(ulong)parsed.m_entry_size,
                     (ulong)parsed.m_entry_size,(ulong)parsed.m_entry_format,
                     (ulong)parsed.m_revision,(ulong)parsed.m_num_extensions,
                     (ulong)(uint)parsed.m_fd_base_address,(ulong)parsed.m_checksum);
            UByteArray::mid((UByteArray *)&paddingIndex,&data,UVar12,0x1c);
            pUVar6 = (UINT8 *)CONCAT53(paddingIndex.i._3_5_,
                                       CONCAT12(paddingIndex.i._2_1_,(undefined2)paddingIndex.i));
            buffer = pUVar6;
            if (pUVar6 != (UINT8 *)0x0) {
              buffer = (UINT8 *)paddingIndex._0_8_;
            }
            buffer[0x13] = '\0';
            bVar11 = calculateChecksum8(buffer,(UINT32)pUVar6);
            if (bVar11 == parsed.m_checksum) {
              Bstrlib::CBString::CBString((CBString *)local_538,", valid");
              Bstrlib::CBString::operator+=(&info_1,(CBString *)local_538);
            }
            else {
              usprintf((CBString *)local_538,", invalid, should be %02Xh",(ulong)bVar11);
              Bstrlib::CBString::operator+=(&info_1,(CBString *)local_538);
            }
            Bstrlib::CBString::~CBString((CBString *)local_538);
            if ((TreeModel **)paddingIndex._0_8_ != &paddingIndex.m) {
              operator_delete((void *)paddingIndex._0_8_);
            }
            if (parsed.n_board_ids == false) {
              usprintf((CBString *)&paddingIndex,"\nRegion index: %Xh\nBoardId Count: %u",
                       (ulong)*(uint *)((long)parsed.m_board_ids._M_t.
                                              super___uniq_ptr_impl<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                                              .
                                              super__Head_base<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_false>
                                              ._M_head_impl + 0x10),
                       (ulong)*(uint *)((long)parsed.m_board_ids._M_t.
                                              super___uniq_ptr_impl<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                                              .
                                              super__Head_base<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_false>
                                              ._M_head_impl + 0x14));
              Bstrlib::CBString::operator+=(&info_1,(CBString *)&paddingIndex);
              Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
              puVar21 = (undefined8 *)
                        **(long **)((long)parsed.m_board_ids._M_t.
                                          super___uniq_ptr_impl<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                                          .
                                          super__Head_base<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_false>
                                          ._M_head_impl + 0x18);
              puVar3 = (undefined8 *)
                       (*(long **)((long)parsed.m_board_ids._M_t.
                                         super___uniq_ptr_impl<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                                         .
                                         super__Head_base<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_false>
                                         ._M_head_impl + 0x18))[1];
              if (puVar21 != puVar3) {
                uVar18 = 0;
                do {
                  usprintf((CBString *)&paddingIndex,"\nBoardId #%u: %lX\n",uVar18,*puVar21);
                  Bstrlib::CBString::operator+=(&info_1,(CBString *)&paddingIndex);
                  Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
                  puVar21 = puVar21 + 1;
                  uVar18 = (ulong)((int)uVar18 + 1);
                } while (puVar21 != puVar3);
              }
            }
            UVar12 = itemOffset;
            pTVar2 = local_628->model;
            Bstrlib::CBString::CBString((CBString *)local_538);
            paddingIndex.i._0_2_ = 0;
            paddingIndex.i._2_1_ = 0;
            paddingIndex.i._3_5_ = 0;
            paddingIndex.m = (TreeModel *)((ulong)paddingIndex.m & 0xffffffffffffff00);
            paddingIndex._0_8_ = &paddingIndex.m;
            TreeModel::addItem(&headerIndex,pTVar2,UVar12 + local_618,'L','\0',&name_1,
                               (CBString *)local_538,&info_1,&header,&body,
                               (UByteArray *)&paddingIndex,Fixed,local_610,'\0');
            if ((TreeModel **)paddingIndex._0_8_ != &paddingIndex.m) {
              operator_delete((void *)paddingIndex._0_8_);
            }
            Bstrlib::CBString::~CBString((CBString *)local_538);
            plVar19 = (long *)**(long **)((long)parsed.m_entries._M_t.
                                                super___uniq_ptr_impl<insyde_fdm_t::fdm_entries_t,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_insyde_fdm_t::fdm_entries_t_*,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
                                                .
                                                super__Head_base<0UL,_insyde_fdm_t::fdm_entries_t_*,_false>
                                                ._M_head_impl + 0x10);
            plVar4 = (long *)(*(long **)((long)parsed.m_entries._M_t.
                                               super___uniq_ptr_impl<insyde_fdm_t::fdm_entries_t,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_insyde_fdm_t::fdm_entries_t_*,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
                                               .
                                               super__Head_base<0UL,_insyde_fdm_t::fdm_entries_t_*,_false>
                                               ._M_head_impl + 0x10))[1];
            if (plVar19 != plVar4) {
              bVar8 = false;
              offset = parsed.m_data_offset;
              do {
                lVar22 = *(long *)(*plVar19 + 0x18);
                paddingIndex._0_8_ = &paddingIndex.m;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&paddingIndex,lVar22,*(long *)(*plVar19 + 0x20) + lVar22);
                guid._0_8_ = *(undefined8 *)paddingIndex._0_8_;
                guid.Data4 = *(UINT8 (*) [8])(paddingIndex._0_8_ + 8);
                if ((TreeModel **)paddingIndex._0_8_ != &paddingIndex.m) {
                  operator_delete((void *)paddingIndex._0_8_);
                }
                insydeFlashDeviceMapEntryTypeGuidToUString((CBString *)&paddingIndex,&guid);
                Bstrlib::CBString::operator=(&name_1,(CBString *)&paddingIndex);
                Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
                Bstrlib::CBString::CBString(&text);
                iVar17 = itemOffset + offset;
                UByteArray::mid((UByteArray *)&paddingIndex,&data,iVar17,0x34);
                std::__cxx11::string::_M_assign((string *)&header);
                if ((TreeModel **)paddingIndex._0_8_ != &paddingIndex.m) {
                  operator_delete((void *)paddingIndex._0_8_);
                }
                UByteArray::mid((UByteArray *)&paddingIndex,&data,
                                iVar17 + (uint)header.d._M_string_length,
                                parsed.m_entry_size - (uint)header.d._M_string_length);
                std::__cxx11::string::_M_assign((string *)&body);
                if ((TreeModel **)paddingIndex._0_8_ != &paddingIndex.m) {
                  operator_delete((void *)paddingIndex._0_8_);
                }
                local_598 = CONCAT44(local_598._4_4_,
                                     (uint)body.d._M_string_length + (uint)header.d._M_string_length
                                    );
                Bstrlib::CBString::CBString(&local_250,"Region type: ");
                guidToUString(&local_280,&guid,false);
                Bstrlib::CBString::operator+((CBString *)local_538,&local_250,&local_280);
                Bstrlib::CBString::operator+((CBString *)&paddingIndex,(CBString *)local_538,"\n");
                Bstrlib::CBString::operator=(&info_1,(CBString *)&paddingIndex);
                Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
                Bstrlib::CBString::~CBString((CBString *)local_538);
                Bstrlib::CBString::~CBString(&local_280);
                Bstrlib::CBString::~CBString(&local_250);
                Bstrlib::CBString::CBString((CBString *)&paddingIndex,"Region id: ");
                Bstrlib::CBString::operator+=(&info_1,(CBString *)&paddingIndex);
                Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
                lVar22 = 0;
                do {
                  paddingIndex._0_8_ = &paddingIndex.m;
                  lVar5 = *(long *)(*plVar19 + 0x38);
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&paddingIndex,lVar5,*(long *)(*plVar19 + 0x40) + lVar5);
                  usprintf((CBString *)local_538,"%02X",
                           (ulong)*(byte *)(paddingIndex._0_8_ + lVar22));
                  Bstrlib::CBString::operator+=(&info_1,(CBString *)local_538);
                  Bstrlib::CBString::~CBString((CBString *)local_538);
                  if ((TreeModel **)paddingIndex._0_8_ != &paddingIndex.m) {
                    operator_delete((void *)paddingIndex._0_8_);
                  }
                  uVar16 = (uint)header.d._M_string_length;
                  lVar22 = lVar22 + 1;
                } while (lVar22 != 0x10);
                uVar7 = CONCAT44(body.d._M_string_length._4_4_,(uint)body.d._M_string_length);
                uVar13 = insyde_fdm_t::fdm_entry_t::region_base((fdm_entry_t *)*plVar19);
                usprintf((CBString *)&paddingIndex,
                         "\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nRegion address: %08Xh\nRegion size: %08Xh\nAttributes: %08Xh"
                         ,local_598 & 0xffffffff,local_598 & 0xffffffff,uVar16,uVar16,uVar7,uVar7,
                         (ulong)uVar13,(ulong)*(uint *)(*plVar19 + 0x60),
                         (ulong)*(uint *)(*plVar19 + 0x68));
                Bstrlib::CBString::operator+=(&info_1,(CBString *)&paddingIndex);
                Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
                if ((*(byte *)(*plVar19 + 0x68) & 1) == 0) {
                  if (!bVar8) {
                    UVar12 = TreeModel::base(local_628->model,&headerIndex);
                    usprintf((CBString *)&paddingIndex,
                             "Insyde Flash Device Map found at base %08Xh\nProtected ranges:\n",
                             (ulong)UVar12);
                    Bstrlib::CBString::operator+=(this_00,(CBString *)&paddingIndex);
                    Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
                    bVar8 = true;
                  }
                  paddingIndex.r = 0;
                  paddingIndex.c = 0;
                  paddingIndex.i._0_2_ = 0;
                  paddingIndex.i._2_1_ = 0;
                  paddingIndex.m = (TreeModel *)&local_5e8;
                  local_5e8._M_local_buf[0] = '\0';
                  paddingIndex.r = insyde_fdm_t::fdm_entry_t::region_base((fdm_entry_t *)*plVar19);
                  paddingIndex.c = *(int *)(*plVar19 + 0x60);
                  paddingIndex.i._0_2_ = 0xb;
                  paddingIndex.i._2_1_ = 9;
                  std::__cxx11::string::_M_assign((string *)&paddingIndex.m);
                  std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::push_back
                            (this_01,(value_type *)&paddingIndex);
                  usprintf(&local_228,"Address: %08Xh Size: %Xh\nHash: ",(ulong)(uint)paddingIndex.r
                           ,(ulong)(uint)paddingIndex.c);
                  UByteArray::toHex((UByteArray *)local_538,&body);
                  Bstrlib::CBString::CBString(&local_60,(char *)local_538._0_8_);
                  Bstrlib::CBString::operator+(&local_280,&local_228,&local_60);
                  Bstrlib::CBString::operator+(&local_250,&local_280,"\n");
                  Bstrlib::CBString::operator+=(this_00,&local_250);
                  Bstrlib::CBString::~CBString(&local_250);
                  Bstrlib::CBString::~CBString(&local_280);
                  Bstrlib::CBString::~CBString(&local_60);
                  if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
                    operator_delete((void *)local_538._0_8_);
                  }
                  Bstrlib::CBString::~CBString(&local_228);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)paddingIndex.m != &local_5e8) {
                    operator_delete(paddingIndex.m);
                  }
                }
                paddingIndex.i._0_2_ = 0;
                paddingIndex.i._2_1_ = 0;
                paddingIndex.i._3_5_ = 0;
                paddingIndex.m = (TreeModel *)((ulong)paddingIndex.m & 0xffffffffffffff00);
                paddingIndex._0_8_ = &paddingIndex.m;
                TreeModel::addItem((UModelIndex *)local_538,local_628->model,offset,'T','\0',&name_1
                                   ,&text,&info_1,&header,&body,(UByteArray *)&paddingIndex,Fixed,
                                   &headerIndex,'\0');
                if ((TreeModel **)paddingIndex._0_8_ != &paddingIndex.m) {
                  operator_delete((void *)paddingIndex._0_8_);
                }
                offset = offset + (int)local_598;
                Bstrlib::CBString::~CBString(&text);
                plVar19 = plVar19 + 1;
              } while (plVar19 != plVar4);
              if (bVar8) {
                Bstrlib::CBString::operator+=(this_00,"\n");
              }
            }
            Bstrlib::CBString::~CBString(&info_1);
            Bstrlib::CBString::~CBString(&name_1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)body.d._M_dataplus._M_p != &body.d.field_2) {
              operator_delete(body.d._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)header.d._M_dataplus._M_p != &header.d.field_2) {
              operator_delete(header.d._M_dataplus._M_p);
            }
            insyde_fdm_t::~insyde_fdm_t(&parsed);
            std::__cxx11::istringstream::~istringstream
                      ((istringstream *)&padding.d._M_string_length);
            std::ios_base::~ios_base(aiStack_178);
            is.super_istream._vptr_basic_istream = (_func_int **)&PTR__umemstream_001a96e8;
            is.super_istream._80_8_ = &PTR__umemstream_001a9710;
            is.super_istream._16_8_ = std::streambuf::overflow;
            std::locale::~locale((locale *)&is.super_istream.field_0x48);
            is.super_istream._vptr_basic_istream =
                 (_func_int **)(std::istream-in-umemstream::construction_vtable + 0x18);
            is.super_istream._80_8_ = 0x1a9760;
            is.super_istream._M_gcount = 0;
            std::ios_base::~ios_base((ios_base *)&is.super_istream.field_0x50);
            _Var20 = fdm.d._M_dataplus;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fdm.d._M_dataplus._M_p != &fdm.d.field_2) goto LAB_001285d4;
            goto LAB_001285d9;
          }
          goto LAB_00128d47;
        }
        is.super_istream._vptr_basic_istream = (_func_int **)0xffffffffffffffff;
        is.super_istream._M_gcount = 0;
        is.super_istream._16_8_ = 0;
        UByteArray::mid(&padding,&data,UVar12,itemSize);
        UVar15 = parseVolumeHeader(local_628,&padding,UVar12 + local_618,local_610,
                                   (UModelIndex *)&is);
        if (UVar15 == 0) {
          if (UVar9 != itemAltSize) {
            usprintf((CBString *)this_02,
                     "%s: volume size stored in header %Xh differs from calculated using block map %Xh"
                     ,"parseRawArea",(ulong)UVar9);
            msg(local_628,(CBString *)this_02,(UModelIndex *)&is);
            goto LAB_001285ba;
          }
        }
        else {
          usprintf((CBString *)&paddingIndex,"%s: volume header parsing failed with error ",
                   "parseRawArea");
          errorCodeToUString((CBString *)&fdm,UVar15);
          Bstrlib::CBString::operator+
                    ((CBString *)this_02,(CBString *)&paddingIndex,(CBString *)&fdm);
          msg(local_628,(CBString *)this_02,local_610);
          Bstrlib::CBString::~CBString((CBString *)this_02);
          Bstrlib::CBString::~CBString((CBString *)&fdm);
          this_02 = (insyde_fdm_t *)&paddingIndex;
LAB_001285ba:
          Bstrlib::CBString::~CBString((CBString *)this_02);
        }
        _Var20._M_p = padding.d._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)padding.d._M_dataplus._M_p != &padding.d.field_2) {
LAB_001285d4:
          operator_delete(_Var20._M_p);
        }
      }
      else if (itemType == 'U') {
        is.super_istream._vptr_basic_istream = (_func_int **)0xffffffffffffffff;
        is.super_istream._M_gcount = 0;
        is.super_istream._16_8_ = 0;
        UByteArray::mid(&padding,&data,UVar12,itemSize);
        UVar15 = parseIntelMicrocodeHeader
                           (local_628,&padding,UVar12 + local_618,local_610,(UModelIndex *)&is);
        if (UVar15 != 0) {
          usprintf((CBString *)&paddingIndex,"%s: microcode header parsing failed with error ",
                   "parseRawArea");
          errorCodeToUString((CBString *)&fdm,UVar15);
          Bstrlib::CBString::operator+
                    ((CBString *)this_02,(CBString *)&paddingIndex,(CBString *)&fdm);
          msg(local_628,(CBString *)this_02,local_610);
          Bstrlib::CBString::~CBString((CBString *)this_02);
          Bstrlib::CBString::~CBString((CBString *)&fdm);
          Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
        }
        _Var20._M_p = padding.d._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)padding.d._M_dataplus._M_p != &padding.d.field_2) goto LAB_001285d4;
      }
      else {
        if (itemType != '\\') goto LAB_00128d47;
        UByteArray::mid(&padding,&data,UVar12,itemSize);
        Bstrlib::CBString::CBString((CBString *)&is,"BPDT region");
        Bstrlib::CBString::operator=(&name,(CBString *)&is);
        Bstrlib::CBString::~CBString((CBString *)&is);
        usprintf((CBString *)&is,"Full size: %Xh (%u)",(ulong)(UINT32)padding.d._M_string_length);
        Bstrlib::CBString::operator=(&info,(CBString *)&is);
        Bstrlib::CBString::~CBString((CBString *)&is);
        pTVar2 = local_628->model;
        Bstrlib::CBString::CBString((CBString *)&fdm);
        is.super_istream._vptr_basic_istream = (_func_int **)&is.super_istream.field_0x10;
        is.super_istream._M_gcount = 0;
        is.super_istream._16_8_ = is.super_istream._16_8_ & 0xffffffffffffff00;
        parsed.super_kstruct.m__io = (kstream *)0x0;
        parsed.m_signature._0_1_ = 0;
        parsed.super_kstruct._vptr_kstruct = (_func_int **)&parsed.m_signature;
        TreeModel::addItem(&paddingIndex,pTVar2,UVar12 + local_618,'\\','\0',&name,(CBString *)&fdm,
                           &info,(UByteArray *)&is,&padding,(UByteArray *)&parsed,Fixed,local_610,
                           '\0');
        if (parsed.super_kstruct._vptr_kstruct != (_func_int **)&parsed.m_signature) {
          operator_delete(parsed.super_kstruct._vptr_kstruct);
        }
        if (is.super_istream._vptr_basic_istream != (_func_int **)&is.super_istream.field_0x10) {
          operator_delete(is.super_istream._vptr_basic_istream);
        }
        Bstrlib::CBString::~CBString((CBString *)&fdm);
        is.super_istream._vptr_basic_istream = (_func_int **)0xffffffffffffffff;
        is.super_istream._M_gcount = 0;
        is.super_istream._16_8_ = 0;
        UVar15 = parseBpdtRegion(local_628,&padding,0,0,&paddingIndex,(UModelIndex *)&is);
        if (UVar15 != 0) {
          usprintf((CBString *)&fdm,"%s: BPDT store parsing failed with error ","parseRawArea");
          errorCodeToUString((CBString *)&header,UVar15);
          Bstrlib::CBString::operator+((CBString *)&parsed,(CBString *)&fdm,(CBString *)&header);
          msg(local_628,(CBString *)&parsed,local_610);
          Bstrlib::CBString::~CBString((CBString *)&parsed);
          Bstrlib::CBString::~CBString((CBString *)&header);
          Bstrlib::CBString::~CBString((CBString *)&fdm);
        }
        _Var20._M_p = padding.d._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)padding.d._M_dataplus._M_p != &padding.d.field_2) goto LAB_001285d4;
      }
LAB_001285d9:
      prevItemOffset = itemOffset;
      prevItemSize = itemSize;
      prevItemType = itemType;
      UVar15 = findNextRawAreaItem(local_628,local_610,itemSize + itemOffset,&itemType,&itemOffset,
                                   &itemSize,&itemAltSize);
    }
    uVar16 = prevItemSize + prevItemOffset;
    parent = local_610;
    itemOffset = uVar16;
    if (uVar16 < (uint)data.d._M_string_length) {
      UByteArray::mid(&padding,&data,uVar16,-1);
      Bstrlib::CBString::CBString((CBString *)&is,"Padding");
      Bstrlib::CBString::operator=(&name,(CBString *)&is);
      Bstrlib::CBString::~CBString((CBString *)&is);
      usprintf((CBString *)&is,"Full size: %Xh (%u)",(ulong)(UINT32)padding.d._M_string_length);
      Bstrlib::CBString::operator=(&info,(CBString *)&is);
      Bstrlib::CBString::~CBString((CBString *)&is);
      pTVar2 = local_628->model;
      UVar10 = getPaddingType(&padding);
      Bstrlib::CBString::CBString((CBString *)&paddingIndex);
      is.super_istream._vptr_basic_istream = (_func_int **)&is.super_istream.field_0x10;
      is.super_istream._M_gcount = 0;
      is.super_istream._16_8_ = is.super_istream._16_8_ & 0xffffffffffffff00;
      parsed.super_kstruct.m__io = (kstream *)0x0;
      parsed.m_signature._0_1_ = 0;
      parsed.super_kstruct._vptr_kstruct = (_func_int **)&parsed.m_signature;
      TreeModel::addItem((UModelIndex *)&fdm,pTVar2,uVar16 + local_618,'@',UVar10,&name,
                         (CBString *)&paddingIndex,&info,(UByteArray *)&is,&padding,
                         (UByteArray *)&parsed,Fixed,local_610,'\0');
      if (parsed.super_kstruct._vptr_kstruct != (_func_int **)&parsed.m_signature) {
        operator_delete(parsed.super_kstruct._vptr_kstruct);
      }
      parent = local_610;
      if (is.super_istream._vptr_basic_istream != (_func_int **)&is.super_istream.field_0x10) {
        operator_delete(is.super_istream._vptr_basic_istream);
      }
      Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)padding.d._M_dataplus._M_p != &padding.d.field_2) {
        operator_delete(padding.d._M_dataplus._M_p);
      }
    }
    UVar15 = 0;
    iVar17 = 0;
    while( true ) {
      iVar14 = TreeModel::rowCount(local_628->model,parent);
      if (iVar14 <= iVar17) break;
      TreeModel::index((TreeModel *)&padding,(char *)parent->m,iVar17);
      bVar11 = TreeModel::type(local_628->model,(UModelIndex *)&padding);
      uVar16 = bVar11 - 0x40;
      if (0x1e < uVar16) goto LAB_00128d47;
      if ((0x50201001U >> (uVar16 & 0x1f) & 1) == 0) {
        if (uVar16 != 1) goto LAB_00128d47;
        parseVolumeBody(local_628,(UModelIndex *)&padding);
      }
      iVar17 = iVar17 + 1;
    }
  }
  else {
    UVar15 = 0;
  }
LAB_0012730e:
  Bstrlib::CBString::~CBString(&info);
  Bstrlib::CBString::~CBString(&name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)data.d._M_dataplus._M_p != &data.d.field_2) {
    operator_delete(data.d._M_dataplus._M_p);
  }
  return UVar15;
LAB_00128d47:
  UVar15 = 9;
  goto LAB_0012730e;
}

Assistant:

USTATUS FfsParser::parseRawArea(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return U_INVALID_PARAMETER;
    
    // Get item data
    UByteArray data = model->body(index);
    UINT32 headerSize = (UINT32)model->header(index).size();
    
    USTATUS result;
    UString name;
    UString info;
    
    // Search for the first item
    UINT8  prevItemType = 0;
    UINT32 prevItemOffset = 0;
    UINT32 prevItemSize = 0;
    UINT32 prevItemAltSize = 0;
    
    result = findNextRawAreaItem(index, 0, prevItemType, prevItemOffset, prevItemSize, prevItemAltSize);
    if (result) {
        // No need to parse further
        return U_SUCCESS;
    }
    
    // Set base of protected regions to be the first volume
    if (model->type(index) == Types::Region
        && model->subtype(index) == Subtypes::BiosRegion) {
        protectedRegionsBase = (UINT64)model->base(index) + prevItemOffset;
    }
    
    // First item is not at the beginning of this raw area
    if (prevItemOffset > 0) {
        // Get info
        UByteArray padding = data.left(prevItemOffset);
        name = UString("Padding");
        info = usprintf("Full size: %Xh (%u)", (UINT32)padding.size(), (UINT32)padding.size());
        
        // Add tree item
        model->addItem(headerSize, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, index);
    }
    
    // Search for and parse all items
    UINT8  itemType = prevItemType;
    UINT32 itemOffset = prevItemOffset;
    UINT32 itemSize = prevItemSize;
    UINT32 itemAltSize = prevItemAltSize;
    
    while (!result) {
        // Padding between items
        if (itemOffset > prevItemOffset + prevItemSize) {
            UINT32 paddingOffset = prevItemOffset + prevItemSize;
            UINT32 paddingSize = itemOffset - paddingOffset;
            UByteArray padding = data.mid(paddingOffset, paddingSize);
            
            // Get info
            name = UString("Padding");
            info = usprintf("Full size: %Xh (%u)", (UINT32)padding.size(), (UINT32)padding.size());
            
            // Add tree item
            model->addItem(headerSize + paddingOffset, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, index);
        }
        
        // Check that item is fully present in input
        if (itemSize > (UINT32)data.size() || itemOffset + itemSize > (UINT32)data.size()) {
            // Mark the rest as padding and finish parsing
            UByteArray padding = data.mid(itemOffset);
            
            // Get info
            name = UString("Padding");
            info = usprintf("Full size: %Xh (%u)", (UINT32)padding.size(), (UINT32)padding.size());
            
            // Add tree item
            UModelIndex paddingIndex = model->addItem(headerSize + itemOffset, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, index);
            msg(usprintf("%s: one of objects inside overlaps the end of data", __FUNCTION__), paddingIndex);
            
            // Update variables
            prevItemOffset = itemOffset;
            prevItemSize = (UINT32)padding.size();
            break;
        }
        
        // Parse current volume header
        if (itemType == Types::Volume) {
            UModelIndex volumeIndex;
            UByteArray volume = data.mid(itemOffset, itemSize);
            result = parseVolumeHeader(volume, headerSize + itemOffset, index, volumeIndex);
            if (result) {
                msg(usprintf("%s: volume header parsing failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            } else {
                // Show messages
                if (itemSize != itemAltSize)
                    msg(usprintf("%s: volume size stored in header %Xh differs from calculated using block map %Xh", __FUNCTION__,
                                 itemSize, itemAltSize),
                        volumeIndex);
            }
        }
        else if (itemType == Types::Microcode) {
            UModelIndex microcodeIndex;
            UByteArray microcode = data.mid(itemOffset, itemSize);
            result = parseIntelMicrocodeHeader(microcode, headerSize + itemOffset, index, microcodeIndex);
            if (result) {
                msg(usprintf("%s: microcode header parsing failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            }
        }
        else if (itemType == Types::BpdtStore) {
            UByteArray bpdtStore = data.mid(itemOffset, itemSize);
            
            // Get info
            name = UString("BPDT region");
            info = usprintf("Full size: %Xh (%u)", (UINT32)bpdtStore.size(), (UINT32)bpdtStore.size());
            
            // Add tree item
            UModelIndex bpdtIndex = model->addItem(headerSize + itemOffset, Types::BpdtStore, 0, name, UString(), info, UByteArray(), bpdtStore, UByteArray(), Fixed, index);
            
            // Parse BPDT region
            UModelIndex bpdtPtIndex;
            result = parseBpdtRegion(bpdtStore, 0, 0, bpdtIndex, bpdtPtIndex);
            if (result) {
                msg(usprintf("%s: BPDT store parsing failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            }
        }
        else if (itemType == Types::InsydeFlashDeviceMapStore) {
            try {
                UByteArray fdm = data.mid(itemOffset, itemSize);
                umemstream is(fdm.constData(), fdm.size());
                kaitai::kstream ks(&is);
                insyde_fdm_t parsed(&ks);
                UINT32 storeSize = (UINT32)fdm.size();
                
                // Construct header and body
                UByteArray header = fdm.left(parsed.data_offset());
                UByteArray body = fdm.mid(header.size(), storeSize - header.size());
                
                // Add info
                UString name = UString("Insyde H2O FlashDeviceMap");
                UString info = usprintf("Signature: HFDM\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nData offset: %Xh\nEntry size: %Xh (%u)\nEntry format: %02Xh\nRevision: %02Xh\nExtension count: %u\nFlash descriptor base address: %08Xh\nChecksum: %02Xh",
                                        storeSize, storeSize,
                                        (UINT32)header.size(), (UINT32)header.size(),
                                        (UINT32)body.size(), (UINT32)body.size(),
                                        parsed.data_offset(),
                                        parsed.entry_size(), parsed.entry_size(),
                                        parsed.entry_format(),
                                        parsed.revision(),
                                        parsed.num_extensions(),
                                        (UINT32)parsed.fd_base_address(),
                                        parsed.checksum());
                
                // Check header checksum
                {
                    UByteArray tempHeader = data.mid(itemOffset, sizeof(INSYDE_FLASH_DEVICE_MAP_HEADER));
                    INSYDE_FLASH_DEVICE_MAP_HEADER* tempFdmHeader = (INSYDE_FLASH_DEVICE_MAP_HEADER*)tempHeader.data();
                    tempFdmHeader->Checksum = 0;
                    UINT8 calculated = calculateChecksum8((const UINT8*)tempFdmHeader, (UINT32)tempHeader.size());
                    if (calculated == parsed.checksum()) {
                        info += UString(", valid");
                    }
                    else {
                        info += usprintf(", invalid, should be %02Xh", calculated);
                    }
                }
                
                // Add board IDs
                if (!parsed._is_null_board_ids()) {
                    info += usprintf("\nRegion index: %Xh\nBoardId Count: %u",
                                     parsed.board_ids()->region_index(),
                                     parsed.board_ids()->num_board_ids());
                    UINT32 i = 0;
                    for (const auto & boardId : *parsed.board_ids()->board_ids()) {
                        info += usprintf("\nBoardId #%u: %" PRIX64 "\n", i++, boardId);
                    }
                }
                
                // Add header tree item
                UModelIndex headerIndex = model->addItem(headerSize + itemOffset, Types::InsydeFlashDeviceMapStore, 0, name, UString(), info, header, body, UByteArray(), Fixed, index);
                
                // Add entries
                UINT32 entryOffset = parsed.data_offset();
                bool protectedRangeFound = false;
                for (const auto & entry : *parsed.entries()->entries()) {
                    const EFI_GUID guid = readUnaligned((const EFI_GUID*)entry->guid().c_str());
                    name = insydeFlashDeviceMapEntryTypeGuidToUString(guid);
                    UString text;
                    header = data.mid(itemOffset + entryOffset, sizeof(INSYDE_FLASH_DEVICE_MAP_ENTRY));
                    body = data.mid(itemOffset + entryOffset + header.size(), parsed.entry_size() - header.size());
                    
                    // Add info
                    UINT32 entrySize = (UINT32)header.size() + (UINT32)body.size();
                    info = UString("Region type: ") + guidToUString(guid, false) + "\n";
                    info += UString("Region id: ");
                    for (UINT8 i = 0; i < 16; i++) {
                        info += usprintf("%02X", *(const UINT8*)(entry->region_id().c_str() + i));
                    }
                    info += usprintf("\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nRegion address: %08Xh\nRegion size: %08Xh\nAttributes: %08Xh",
                                     entrySize, entrySize,
                                     (UINT32)header.size(), (UINT32)header.size(),
                                     (UINT32)body.size(), (UINT32)body.size(),
                                     (UINT32)entry->region_base(),
                                     (UINT32)entry->region_size(),
                                     entry->attributes());
                    
                    if ((entry->attributes() & INSYDE_FLASH_DEVICE_MAP_ENTRY_ATTRIBUTE_MODIFIABLE) == 0) {
                        if (!protectedRangeFound) {
                            securityInfo += usprintf("Insyde Flash Device Map found at base %08Xh\nProtected ranges:\n", model->base(headerIndex));
                            protectedRangeFound = true;
                        }
                        
                        // TODO: make sure that the only hash possible here is SHA256
                        
                        // Add this region to the list of Insyde protected regions
                        PROTECTED_RANGE range = {};
                        range.Offset = (UINT32)entry->region_base();
                        range.Size = (UINT32)entry->region_size();
                        range.AlgorithmId = TCG_HASH_ALGORITHM_ID_SHA256;
                        range.Type = PROTECTED_RANGE_VENDOR_HASH_INSYDE;
                        range.Hash = body;
                        protectedRanges.push_back(range);
                        
                        securityInfo += usprintf("Address: %08Xh Size: %Xh\nHash: ", range.Offset, range.Size) + UString(body.toHex().constData()) + "\n";
                    }
                    
                    // Add tree item
                    model->addItem(entryOffset, Types::InsydeFlashDeviceMapEntry, 0, name, text, info, header, body, UByteArray(), Fixed, headerIndex);
                    
                    entryOffset += entrySize;
                }
                
                if (protectedRangeFound) {
                    securityInfo += "\n";
                }
            }
            catch (...) {
                // Parsing failed
            }
        }
        else {
            return U_UNKNOWN_ITEM_TYPE;
        }
        
        // Go to next item
        prevItemOffset = itemOffset;
        prevItemSize = itemSize;
        prevItemType = itemType;
        result = findNextRawAreaItem(index, itemOffset + prevItemSize, itemType, itemOffset, itemSize, itemAltSize);
        
        // Silence value not used after assignment warning
        (void)prevItemType;
    }
    
    // Padding at the end of RAW area
    itemOffset = prevItemOffset + prevItemSize;
    if ((UINT32)data.size() > itemOffset) {
        UByteArray padding = data.mid(itemOffset);
        
        // Get info
        name = UString("Padding");
        info = usprintf("Full size: %Xh (%u)", (UINT32)padding.size(), (UINT32)padding.size());
        
        // Add tree item
        model->addItem(headerSize + itemOffset, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, index);
    }
    
    // Parse bodies
    for (int i = 0; i < model->rowCount(index); i++) {
        UModelIndex current = index.model()->index(i, 0, index);
        
        switch (model->type(current)) {
            case Types::Volume:
                parseVolumeBody(current);
                break;
            case Types::Microcode:
                // Parsing already done
                break;
            case Types::BpdtStore:
                // Parsing already done
                break;
            case Types::BpdtPartition:
                // Parsing already done
                break;
            case Types::InsydeFlashDeviceMapStore:
                // Parsing already done
                break;
            case Types::Padding:
                // No parsing required
                break;
            default:
                return U_UNKNOWN_ITEM_TYPE;
        }
    }
    
    return U_SUCCESS;
}